

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::PointTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PointTestInstance *this)

{
  size_type *psVar1;
  ulong uVar2;
  deUint32 width;
  size_t **ppsVar3;
  undefined1 auVar4 [8];
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  pointer pVVar11;
  ulong *puVar12;
  ulong uVar13;
  float extraout_XMM0_Da;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> points;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  string iterationDescription;
  ScopedLogSection section;
  RasterizationArguments args;
  IVec4 colorBits;
  PointSceneSpec scene;
  pointer local_268;
  pointer pSStack_260;
  pointer local_258 [2];
  Surface local_248;
  long lStack_230;
  undefined1 local_228 [24];
  long lStack_210;
  string local_200;
  ScopedLogSection local_1e0;
  RasterizationArguments local_1d8;
  undefined4 uStack_1c4;
  int local_1b8 [4];
  undefined1 local_1a8 [8];
  pointer pSStack_1a0;
  pointer local_198 [12];
  ios_base local_138 [8];
  ios_base local_130 [264];
  
  iVar8 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0xb7ca2c);
  pVVar11 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pVVar11) {
    local_228._16_8_ = *(undefined8 *)pVVar11->m_data;
    lStack_210 = plVar9[3];
    local_228._0_8_ = (pointer)(local_228 + 0x10);
  }
  else {
    local_228._16_8_ = *(undefined8 *)pVVar11->m_data;
    local_228._0_8_ = (pointer)*plVar9;
  }
  local_228._8_8_ = plVar9[1];
  *plVar9 = (long)pVVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_228);
  ppsVar3 = (size_t **)&local_248.m_pixels.m_cap;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_248.m_pixels.m_cap = *puVar12;
    lStack_230 = plVar9[3];
    local_248._0_8_ = ppsVar3;
  }
  else {
    local_248.m_pixels.m_cap = *puVar12;
    local_248._0_8_ = (ulong *)*plVar9;
  }
  local_248.m_pixels.m_ptr = (void *)plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar2 = CONCAT44(local_1d8.greenBits,local_1d8.redBits) + (long)local_248.m_pixels.m_ptr;
  uVar13 = 0xf;
  if ((size_t **)local_248._0_8_ != ppsVar3) {
    uVar13 = local_248.m_pixels.m_cap;
  }
  if (uVar13 < uVar2) {
    uVar13 = 0xf;
    if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
      uVar13 = CONCAT44(uStack_1c4,local_1d8.blueBits);
    }
    if (uVar2 <= uVar13) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_248._0_8_);
      goto LAB_007e477b;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_248,CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples));
LAB_007e477b:
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200.field_2._8_8_ = puVar10[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_200._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples),
                    CONCAT44(uStack_1c4,local_1d8.blueBits) + 1);
  }
  if ((size_t **)local_248._0_8_ != ppsVar3) {
    operator_delete((void *)local_248._0_8_,local_248.m_pixels.m_cap + 1);
  }
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(float *)local_228._16_8_ + 1));
  }
  if (local_268 != (pointer)local_258) {
    operator_delete(local_268,(long)local_258[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1e0,
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log,&local_200,&local_200);
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])(this);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&local_248,width,width);
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  local_258[0] = (pointer)0x0;
  local_268 = (pointer)0x0;
  pSStack_260 = (pointer)0x0;
  if (extraout_XMM0_Da <= this->m_maxPointSize) {
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[7])
              (this,(ulong)(uint)this->m_iteration,local_228);
    BaseRenderingTestInstance::drawPrimitives
              (&this->super_BaseRenderingTestInstance,&local_248,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,
               VK_PRIMITIVE_TOPOLOGY_POINT_LIST);
    local_1a8 = (undefined1  [8])0x0;
    pSStack_1a0 = (pointer)0x0;
    local_198[0] = (pointer)0x0;
    tcu::getTextureFormatBitDepth
              ((tcu *)local_1b8,&(this->super_BaseRenderingTestInstance).m_textureFormat);
    pSVar6 = local_198[0];
    pSVar5 = pSStack_1a0;
    auVar4 = local_1a8;
    local_1d8.numSamples = (int)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
    local_1d8.subpixelBits = (this->super_BaseRenderingTestInstance).m_subpixelBits;
    local_1d8.redBits = local_1b8[0];
    local_1d8.greenBits = (int)local_1b8._4_8_;
    local_1d8.blueBits = SUB84(local_1b8._4_8_,4);
    local_1a8 = (undefined1  [8])local_268;
    pSStack_1a0 = pSStack_260;
    local_198[0] = local_258[0];
    local_268 = (pointer)auVar4;
    pSStack_260 = pSVar5;
    local_258[0] = pSVar6;
    bVar7 = tcu::verifyPointGroupRasterization
                      (&local_248,(PointSceneSpec *)local_1a8,&local_1d8,
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    if (!bVar7) {
      this->m_allIterationsPassed = false;
    }
    if (local_1a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a8,(long)local_198[0] - (long)local_1a8);
    }
  }
  else {
    local_1a8 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1a0,"Point size ",0xb);
    std::ostream::_M_insert<double>((double)extraout_XMM0_Da);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1a0," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1a0);
    std::ios_base::~ios_base(local_130);
  }
  iVar8 = this->m_iteration + 1;
  this->m_iteration = iVar8;
  if (iVar8 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Pass","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8,
                 (long)(pSStack_1a0->position).m_data + (long)local_1a8);
    }
    else {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Incorrect rasterization","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8,
                 (long)(pSStack_1a0->position).m_data + (long)local_1a8);
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,(ulong)((long)(local_198[0]->position).m_data + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if (local_268 != (pointer)0x0) {
    operator_delete(local_268,(long)local_258[0] - (long)local_268);
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
  }
  tcu::Surface::~Surface(&local_248);
  tcu::TestLog::endSection(local_1e0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus PointTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	const float								pointSize				= getPointSize();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<PointSceneSpec::ScenePoint>	points;

	// supported?
	if (pointSize <= m_maxPointSize)
	{
		// gen data
		generatePoints(m_iteration, drawBuffer, points);

		// draw image
		drawPrimitives(resultImage, drawBuffer, VK_PRIMITIVE_TOPOLOGY_POINT_LIST);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			PointSceneSpec			scene;

			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.points.swap(points);

			compareOk = verifyPointGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Point size " << pointSize << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}